

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::__cxx11::string,char,char_const*,char[18],std::__cxx11::string,char[4],std::__cxx11::string,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,char **args_2,char (*args_3) [18],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
                   char (*args_5) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
                   char (*args_7) [3])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_268;
  cmAlphaNum local_238;
  cmAlphaNum local_208;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char **local_38;
  char **args_local_2;
  char *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char **)args_1;
  args_local_1 = (char *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_e8 = cmAlphaNum::View(a);
  local_d8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_118,(string *)args_local_1);
  local_c8 = cmAlphaNum::View(&local_118);
  cmAlphaNum::cmAlphaNum(&local_148,*(char *)args_local_2);
  local_b8 = cmAlphaNum::View(&local_148);
  cmAlphaNum::cmAlphaNum(&local_178,*local_38);
  local_a8 = cmAlphaNum::View(&local_178);
  cmAlphaNum::cmAlphaNum(&local_1a8,*args_3);
  local_98 = cmAlphaNum::View(&local_1a8);
  cmAlphaNum::cmAlphaNum(&local_1d8,args_4);
  local_88 = cmAlphaNum::View(&local_1d8);
  cmAlphaNum::cmAlphaNum(&local_208,*args_5);
  local_78 = cmAlphaNum::View(&local_208);
  cmAlphaNum::cmAlphaNum(&local_238,args_6);
  local_68 = cmAlphaNum::View(&local_238);
  cmAlphaNum::cmAlphaNum(&local_268,*args_7);
  local_58 = cmAlphaNum::View(&local_268);
  local_48 = &local_e8;
  local_40 = 10;
  views._M_len = 10;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}